

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::SobolSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,SobolSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  pointer pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int64_t iVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  allocator_type local_29;
  
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_29);
  iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,(long)n << 5,8);
  pSVar2 = (__return_storage_ptr__->
           super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = CONCAT44(extraout_var,iVar6);
  for (lVar7 = 0; (ulong)(uint)(~(n >> 0x1f) & n) << 3 != lVar7; lVar7 = lVar7 + 8) {
    uVar3 = *(undefined8 *)&this->randomizeStrategy;
    uVar4 = *(undefined8 *)&(this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
    iVar5 = this->sequenceIndex;
    uVar9 = uVar8 | 0x5000000000000;
    uVar8 = uVar8 + 0x20;
    puVar1 = (undefined8 *)(CONCAT44(extraout_var,iVar6) + lVar7 * 4);
    *puVar1 = *(undefined8 *)this;
    puVar1[1] = uVar3;
    puVar1[2] = uVar4;
    puVar1[3] = iVar5;
    *(ulong *)((long)&(pSVar2->
                      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits + lVar7) = uVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> SobolSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    SobolSampler *samplerMem = (SobolSampler *)alloc.allocate_object<SobolSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}